

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix4 * matrix4_scalev3(matrix4 *self,vector3 *scale)

{
  matrix4 scalingMatrix;
  anon_union_64_5_d0a4420b_for_matrix4_0 local_48;
  
  local_48._4_8_ = 0;
  local_48._12_8_ = 0;
  local_48._24_8_ = 0;
  local_48._32_8_ = 0;
  local_48._44_8_ = 0;
  local_48._52_8_ = 0;
  local_48.m[0xf] = 1.0;
  local_48.m[0] = (scale->field_0).v[0];
  local_48.m[5] = (scale->field_0).v[1];
  local_48.m[10] = (scale->field_0).v[2];
  matrix4_multiply(self,(matrix4 *)&local_48.field_1);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_scalev3(struct matrix4 *self, const struct vector3 *scale)
{
	struct matrix4 scalingMatrix;

	return matrix4_multiply(self,
		matrix4_make_transformation_scalingv3(&scalingMatrix, scale));
}